

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O0

void __thiscall asl::Thread::~Thread(Thread *this)

{
  Thread *this_local;
  
  this->_vptr_Thread = (_func_int **)&PTR__Thread_0018c7c0;
  if (this->_thread != 0) {
    pthread_detach(this->_thread);
  }
  return;
}

Assistant:

virtual ~Thread()
	{
		if (_thread != 0) {
#ifdef _WIN32
			CloseHandle(_thread);
#else
			pthread_detach(_thread);
#endif
		}
	}